

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_tri_metric_area(REF_NODE ref_node,REF_INT *nodes,REF_DBL *area)

{
  int iVar1;
  REF_DBL *pRVar2;
  uint uVar3;
  long lVar4;
  REF_DBL det;
  REF_DBL m [6];
  REF_DBL mlog [6];
  REF_DBL mlog2 [6];
  REF_DBL mlog1 [6];
  REF_DBL mlog0 [6];
  double local_120;
  REF_DBL local_118 [6];
  REF_DBL local_e8 [6];
  REF_DBL aRStack_b8 [6];
  REF_DBL aRStack_88 [6];
  REF_DBL aRStack_58 [7];
  
  uVar3 = ref_node_tri_area(ref_node,nodes,area);
  if (uVar3 == 0) {
    iVar1 = *nodes;
    pRVar2 = ref_node->real;
    lVar4 = 0;
    do {
      aRStack_58[lVar4] = pRVar2[iVar1 * 0xf + 9 + (int)lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 6);
    iVar1 = nodes[1];
    lVar4 = 0;
    do {
      aRStack_88[lVar4] = pRVar2[iVar1 * 0xf + 9 + (int)lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 6);
    iVar1 = nodes[2];
    lVar4 = 0;
    do {
      aRStack_b8[lVar4] = pRVar2[iVar1 * 0xf + 9 + (int)lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 6);
    lVar4 = 0;
    do {
      local_e8[lVar4] = (aRStack_58[lVar4] + aRStack_88[lVar4] + aRStack_b8[lVar4]) / 3.0;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 6);
    uVar3 = ref_matrix_exp_m(local_e8,local_118);
    if (uVar3 == 0) {
      uVar3 = ref_matrix_det_m(local_118,&local_120);
      if (uVar3 == 0) {
        if (local_120 < 0.0) {
          local_120 = sqrt(local_120);
        }
        else {
          local_120 = SQRT(local_120);
        }
        *area = local_120 * *area * 2.3094010767585034;
        uVar3 = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x938,"ref_node_tri_metric_area",(ulong)uVar3,"det(mavg)");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x937,
             "ref_node_tri_metric_area",(ulong)uVar3,"exp");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x932,
           "ref_node_tri_metric_area",(ulong)uVar3,"tri area");
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_node_tri_metric_area(REF_NODE ref_node, REF_INT *nodes,
                                            REF_DBL *area) {
  REF_DBL mlog0[6], mlog1[6], mlog2[6];
  REF_DBL mlog[6], m[6], det;
  REF_INT i;

  RSS(ref_node_tri_area(ref_node, nodes, area), "tri area");
  RSS(ref_node_metric_get_log(ref_node, nodes[0], mlog0), "log0");
  RSS(ref_node_metric_get_log(ref_node, nodes[1], mlog1), "log1");
  RSS(ref_node_metric_get_log(ref_node, nodes[2], mlog2), "log2");
  for (i = 0; i < 6; i++) mlog[i] = (mlog0[i] + mlog1[i] + mlog2[i]) / 3.0;
  RSS(ref_matrix_exp_m(mlog, m), "exp");
  RSS(ref_matrix_det_m(m, &det), "det(mavg)");
  (*area) *= sqrt(det);
  (*area) *= 4.0 / sqrt(3.0);

  return REF_SUCCESS;
}